

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uefitool_main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_30 [8];
  UEFIToolApplication a;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  a.tool = (UEFITool *)argv;
  argv_local._0_4_ = argc;
  UEFIToolApplication::UEFIToolApplication((UEFIToolApplication *)local_30,(int *)&argv_local,argv);
  argv_local._4_4_ = UEFIToolApplication::startup((UEFIToolApplication *)local_30);
  UEFIToolApplication::~UEFIToolApplication((UEFIToolApplication *)local_30);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    UEFIToolApplication a(argc, argv);
    return a.startup();
}